

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::Clara::Detail::ParserBase::parse
          (InternalParseResult *__return_storage_ptr__,ParserBase *this,Args *args)

{
  TokenStream TStack_48;
  
  TokenStream::TokenStream(&TStack_48,args);
  (*this->_vptr_ParserBase[3])(__return_storage_ptr__,this,args,&TStack_48);
  std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::~vector
            (&TStack_48.m_tokenBuffer);
  return __return_storage_ptr__;
}

Assistant:

InternalParseResult ParserBase::parse( Args const& args ) const {
                return parse( args.exeName(), TokenStream( args ) );
            }